

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funcuvname(lua_State *L)

{
  long lVar1;
  uint idx_00;
  GCproto *pt_00;
  char *__s;
  GCstr *pGVar2;
  long in_RDI;
  bool bVar3;
  uint32_t idx;
  GCproto *pt;
  undefined8 in_stack_ffffffffffffff60;
  int nolua;
  lua_State *in_stack_ffffffffffffff68;
  uint local_6c;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  nolua = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  pt_00 = check_Lproto(in_stack_ffffffffffffff68,nolua);
  idx_00 = lj_lib_checkint(in_stack_ffffffffffffff68,nolua);
  bVar3 = idx_00 < pt_00->sizeuv;
  if (bVar3) {
    lVar1 = *(long *)(in_RDI + 0x18);
    lj_debug_uvname(pt_00,idx_00);
    __s = lj_debug_uvname(pt_00,idx_00);
    strlen(__s);
    pGVar2 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *(int *)(lVar1 + -8) = (int)pGVar2;
    *(undefined4 *)(lVar1 + -4) = 0xfffffffb;
  }
  local_6c = (uint)bVar3;
  return local_6c;
}

Assistant:

LJLIB_CF(jit_util_funcuvname)
{
  GCproto *pt = check_Lproto(L, 0);
  uint32_t idx = (uint32_t)lj_lib_checkint(L, 2);
  if (idx < pt->sizeuv) {
    setstrV(L, L->top-1, lj_str_newz(L, lj_debug_uvname(pt, idx)));
    return 1;
  }
  return 0;
}